

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O3

ostringstream *
toml::detail::format_underline(ostringstream *oss,size_t lnw,size_t col,size_t len,string *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  char local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_38 = msg;
  if (lnw + 1 == 0) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_78,lnw + 1,' ');
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)oss,local_78._M_dataplus._M_p,local_78._M_string_length);
  if (color::ansi::detail::color_status()::status == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[01m",5);
  }
  if ((color::ansi::detail::color_status()::status & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[34m",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
  if (color::ansi::detail::color_status()::status == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  if (col < 2) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_78,col - 1,' ');
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)oss,local_78._M_dataplus._M_p,local_78._M_string_length);
  if (color::ansi::detail::color_status()::status == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[01m",5);
  }
  if ((color::ansi::detail::color_status()::status & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[31m",5);
  }
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  if (len == 0) {
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_58,len,'^');
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-- ",3);
  if (color::ansi::detail::color_status()::status == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
  local_79 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_79,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return oss;
}

Assistant:

TOML11_INLINE std::ostringstream& format_underline(std::ostringstream& oss,
        const std::size_t lnw, const std::size_t col, const std::size_t len,
        const std::string& msg)
{
    //    |       ^^^^^^^-- this part
    oss << make_string(lnw + 1, ' ')
        << color::bold << color::blue << " | " << color::reset;

    // in case col is 0, so we don't create a string with size_t max length
    const std::size_t sanitized_col = col == 0 ? 0 : col - 1 /*1-origin*/;
    oss << make_string(sanitized_col, ' ')
        << color::bold << color::red
        << make_string(len, '^') << "-- "
        << color::reset << msg << '\n';

    return oss;
}